

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int stbi__hdr_test(stbi__context *s)

{
  int local_14;
  int r;
  stbi__context *s_local;
  
  local_14 = stbi__hdr_test_core(s,"#?RADIANCE\n");
  stbi__rewind(s);
  if (local_14 == 0) {
    local_14 = stbi__hdr_test_core(s,"#?RGBE\n");
    stbi__rewind(s);
  }
  return local_14;
}

Assistant:

static int stbi__hdr_test(stbi__context* s)
{
   int r = stbi__hdr_test_core(s, "#?RADIANCE\n");
   stbi__rewind(s);
   if(!r) {
       r = stbi__hdr_test_core(s, "#?RGBE\n");
       stbi__rewind(s);
   }
   return r;
}